

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_path_builder_delegate_unittest.cc
# Opt level: O0

string * __thiscall
bssl::(anonymous_namespace)::
gtest_AllSimplePathBuilderDelegate1024SuccessTest_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          TestParamInfo<const_char_*> *info)

{
  bool bVar1;
  TestParamInfo<const_char_*> *extraout_RDX;
  TestParamInfo<const_char_*> *extraout_RDX_00;
  TestParamInfo<const_char_*> *info_00;
  ParamGenerator<const_char_*> local_38;
  undefined1 local_28 [8];
  tuple<testing::internal::ParamGenerator<const_char_*>_> t;
  TestParamInfo<const_char_*> *info_local;
  
  t.super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_char_*>_>.
  super__Head_base<0UL,_testing::internal::ParamGenerator<const_char_*>,_false>._M_head_impl.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_char_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  bVar1 = testing::internal::AlwaysFalse();
  info_00 = extraout_RDX;
  if (bVar1) {
    testing::internal::TestNotEmpty<std::__cxx11::string(testing::TestParamInfo<char_const*>const&)>
              (testing::internal::DefaultParamName<char_const*>);
    testing::ValuesIn<char_const*,8ul>((testing *)&local_38,(char *(*) [8])kSuccess1024Filenames);
    ::std::make_tuple<testing::internal::ParamGenerator<char_const*>>
              ((ParamGenerator<const_char_*> *)local_28);
    testing::internal::ParamGenerator<const_char_*>::~ParamGenerator(&local_38);
    ::std::tuple<testing::internal::ParamGenerator<const_char_*>_>::~tuple
              ((tuple<testing::internal::ParamGenerator<const_char_*>_> *)local_28);
    info_00 = extraout_RDX_00;
  }
  testing::internal::DefaultParamName<char_const*>
            (__return_storage_ptr__,
             (internal *)
             t.super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_char_*>_>.
             super__Head_base<0UL,_testing::internal::ParamGenerator<const_char_*>,_false>.
             _M_head_impl.impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_char_*>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,info_00);
  return __return_storage_ptr__;
}

Assistant:

TEST_P(SimplePathBuilderDelegate1024SuccessTest, IsAcceptableSignatureAndKey) {
  SignatureAlgorithm signature_algorithm{};
  bssl::UniquePtr<EVP_PKEY> public_key;
  ASSERT_NO_FATAL_FAILURE(
      ReadTestCase(GetParam(), &signature_algorithm, &public_key));
  ASSERT_TRUE(public_key);

  CertErrors errors;
  SimplePathBuilderDelegate delegate(
      1024, SimplePathBuilderDelegate::DigestPolicy::kWeakAllowSha1);

  EXPECT_TRUE(
      delegate.IsSignatureAlgorithmAcceptable(signature_algorithm, &errors));

  EXPECT_TRUE(delegate.IsPublicKeyAcceptable(public_key.get(), &errors));
}